

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nihgui.cpp
# Opt level: O0

void __thiscall Dialog::check_mouse_over(Dialog *this,int mx,int my)

{
  _List_node_base *p_Var1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  reference ppWVar5;
  uint in_EDX;
  uint in_ESI;
  list<Widget_*,_std::allocator<Widget_*>_> *in_RDI;
  iterator it;
  _Self local_20;
  _Self local_18;
  uint local_10;
  uint local_c;
  
  local_10 = in_EDX;
  local_c = in_ESI;
  if ((in_RDI[3].super__List_base<Widget_*,_std::allocator<Widget_*>_>._M_impl._M_node.
       super__List_node_base._M_next == (_List_node_base *)0x0) ||
     (p_Var1 = in_RDI[3].super__List_base<Widget_*,_std::allocator<Widget_*>_>._M_impl._M_node.
               super__List_node_base._M_next,
     uVar4 = (*(code *)p_Var1->_M_next[1]._M_next)(p_Var1,in_ESI,in_EDX), (uVar4 & 1) == 0)) {
    local_18._M_node =
         (_List_node_base *)std::__cxx11::list<Widget_*,_std::allocator<Widget_*>_>::begin(in_RDI);
    while( true ) {
      local_20._M_node =
           (_List_node_base *)std::__cxx11::list<Widget_*,_std::allocator<Widget_*>_>::end(in_RDI);
      bVar2 = std::operator!=(&local_18,&local_20);
      if (!bVar2) break;
      ppWVar5 = std::_List_iterator<Widget_*>::operator*((_List_iterator<Widget_*> *)0x10acc5);
      uVar3 = (*(*ppWVar5)->_vptr_Widget[2])(*ppWVar5,(ulong)local_c,(ulong)local_10);
      if ((uVar3 & 1) != 0) {
        ppWVar5 = std::_List_iterator<Widget_*>::operator*((_List_iterator<Widget_*> *)0x10ace6);
        uVar3 = (*(*ppWVar5)->_vptr_Widget[3])();
        if ((uVar3 & 1) != 0) {
          ppWVar5 = std::_List_iterator<Widget_*>::operator*((_List_iterator<Widget_*> *)0x10acff);
          in_RDI[3].super__List_base<Widget_*,_std::allocator<Widget_*>_>._M_impl._M_node.
          super__List_node_base._M_next = (_List_node_base *)*ppWVar5;
          (*(code *)(in_RDI[3].super__List_base<Widget_*,_std::allocator<Widget_*>_>._M_impl._M_node
                     .super__List_node_base._M_next)->_M_next[2]._M_next)();
          return;
        }
      }
      std::_List_iterator<Widget_*>::operator++(&local_18);
    }
    if (in_RDI[3].super__List_base<Widget_*,_std::allocator<Widget_*>_>._M_impl._M_node.
        super__List_node_base._M_next != (_List_node_base *)0x0) {
      (*(code *)(in_RDI[3].super__List_base<Widget_*,_std::allocator<Widget_*>_>._M_impl._M_node.
                 super__List_node_base._M_next)->_M_next[2]._M_prev)();
      in_RDI[3].super__List_base<Widget_*,_std::allocator<Widget_*>_>._M_impl._M_node.
      super__List_node_base._M_next = (_List_node_base *)0x0;
    }
  }
  return;
}

Assistant:

void Dialog::check_mouse_over(int mx, int my)
{
   if (this->mouse_over_widget && this->mouse_over_widget->contains(mx, my)) {
      /* no change */
      return;
   }

   for (std::list<Widget*>::iterator it = this->all_widgets.begin();
         it != this->all_widgets.end();
         ++it)
   {
      if ((*it)->contains(mx, my) && (*it)->want_mouse_focus()) {
         this->mouse_over_widget = (*it);
         this->mouse_over_widget->got_mouse_focus();
         return;
      }
   }

   if (this->mouse_over_widget) {
      this->mouse_over_widget->lost_mouse_focus();
      this->mouse_over_widget = NULL;
   }
}